

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O2

PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,MatrixType *matrix)

{
  TranspositionType *this_00;
  long lVar1;
  Index nb_transpositions;
  uint local_1c;
  
  if (0x7ffffffe <
      (matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    __assert_fail("matrix.rows()<NumTraits<int>::highest()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/LU/PartialPivLU.h"
                  ,0x186,
                  "PartialPivLU<MatrixType> &Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  lVar1 = (matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (lVar1 == (matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols) {
    this_00 = &this->m_rowsTranspositions;
    TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::resize
              ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)this_00,(int)lVar1);
    internal::
    partial_lu_inplace<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpositions<_1,_1,int>>
              (&this->m_lu,this_00,(Index *)&local_1c);
    this->m_det_p = -(ulong)(local_1c & 1) | 1;
    PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::operator=
              ((PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *)&this->m_p,
               (TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)this_00);
    this->m_isInitialized = true;
    return this;
  }
  __assert_fail("matrix.rows() == matrix.cols() && \"PartialPivLU is only for square (and moreover invertible) matrices\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/LU/PartialPivLU.h"
                ,0x18a,
                "PartialPivLU<MatrixType> &Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

PartialPivLU<MatrixType>& PartialPivLU<MatrixType>::compute(const MatrixType& matrix)
{
  // the row permutation is stored as int indices, so just to be sure:
  eigen_assert(matrix.rows()<NumTraits<int>::highest());
  
  m_lu = matrix;

  eigen_assert(matrix.rows() == matrix.cols() && "PartialPivLU is only for square (and moreover invertible) matrices");
  const Index size = matrix.rows();

  m_rowsTranspositions.resize(size);

  typename TranspositionType::Index nb_transpositions;
  internal::partial_lu_inplace(m_lu, m_rowsTranspositions, nb_transpositions);
  m_det_p = (nb_transpositions%2) ? -1 : 1;

  m_p = m_rowsTranspositions;

  m_isInitialized = true;
  return *this;
}